

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isojoliet_rr.c
# Opt level: O2

void test_read_format_isojoliet_rr(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  uint uVar4;
  archive *paVar5;
  char *pcVar6;
  int64_t iVar7;
  time_t tVar8;
  long v2;
  stat *psVar9;
  void *p;
  archive *local_50;
  int64_t offset;
  size_t size;
  archive_entry *ae;
  
  extract_reference_file("test_read_format_iso_joliet_rockridge.iso.Z");
  paVar5 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                   ,L'D',(uint)(paVar5 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'E',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'F',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename(paVar5,"test_read_format_iso_joliet_rockridge.iso.Z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'H',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'K',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'L',".","\".\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'M',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  iVar7 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'N',0x800,"2048",iVar7,"archive_entry_size(ae)",(void *)0x0);
  tVar8 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'O',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
  v2 = archive_entry_mtime_nsec(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'P',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
  psVar9 = archive_entry_stat((archive_entry_conflict *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'Q',3,"3",psVar9->st_nlink,"archive_entry_stat(ae)->st_nlink",(void *)0x0);
  iVar7 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'R',1,"1",iVar7,"archive_entry_uid(ae)",(void *)0x0);
  iVar1 = archive_read_data_block(paVar5,&p,&size,&offset);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'T',1,"ARCHIVE_EOF",(long)iVar1,
                      "archive_read_data_block(a, &p, &size, &offset)",paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'U',(long)(int)size,"(int)size",0,"0",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'V',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'W',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'Z',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'[',"dir","\"dir\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\\',0x4000,"AE_IFDIR",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0
                     );
  iVar7 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L']',0x800,"2048",iVar7,"archive_entry_size(ae)",(void *)0x0);
  tVar8 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'^',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
  tVar8 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'_',0x15181,"86401",tVar8,"archive_entry_atime(ae)",(void *)0x0);
  psVar9 = archive_entry_stat((archive_entry_conflict *)ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'`',2,"2",psVar9->st_nlink,"archive_entry_stat(ae)->st_nlink",(void *)0x0);
  iVar7 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'a',1,"1",iVar7,"archive_entry_uid(ae)",(void *)0x0);
  iVar7 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'b',2,"2",iVar7,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'c',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'd',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
  local_50 = paVar5;
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'h',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'j',"hardlink","\"hardlink\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'k',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",(void *)0x0)
  ;
  pcVar6 = archive_entry_hardlink(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                   ,L'l',(uint)(pcVar6 == (char *)0x0),"archive_entry_hardlink(ae) == NULL",
                   (void *)0x0);
  iVar7 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'm',6,"6",iVar7,"archive_entry_size(ae)",(void *)0x0);
  iVar1 = archive_read_data_block(paVar5,&p,&size,&offset);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'n',0,"0",(long)iVar1,"archive_read_data_block(a, &p, &size, &offset)",
                      (void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'o',6,"6",(long)(int)size,"(int)size",(void *)0x0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'p',0,"0",offset,"offset",(void *)0x0);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'q',p,"p","hello\n","\"hello\\n\"",6,"6",(void *)0x0);
  tVar8 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'r',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'x',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
  iVar7 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'y',1,"1",iVar7,"archive_entry_uid(ae)",(void *)0x0);
  iVar7 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'z',2,"2",iVar7,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'{',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  paVar5 = local_50;
  iVar1 = archive_read_has_encrypted_entries(local_50);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'|',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x80',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x82',"long-joliet-file-name.textfile","\"long-joliet-file-name.textfile\"",pcVar6,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x83',0x8000,"AE_IFREG",(ulong)mVar3,"archive_entry_filetype(ae)",
                      (void *)0x0);
  pcVar6 = archive_entry_hardlink(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x85',"hardlink","\"hardlink\"",pcVar6,"archive_entry_hardlink(ae)",(void *)0x0,
             L'\0');
  wVar2 = archive_entry_size_is_set(ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                   ,L'\x86',(uint)(wVar2 == L'\0'),"!archive_entry_size_is_set(ae)",(void *)0x0);
  tVar8 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x87',0x15181,"86401",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
  tVar8 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x88',0x15181,"86401",tVar8,"archive_entry_atime(ae)",(void *)0x0);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8a',2,"2",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
  iVar7 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8b',1,"1",iVar7,"archive_entry_uid(ae)",(void *)0x0);
  iVar7 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8c',2,"2",iVar7,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8d',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x8e',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x91',0,"0",(long)iVar1,"archive_read_next_header(a, &ae)",(void *)0x0);
  pcVar6 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x92',"symlink","\"symlink\"",pcVar6,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  mVar3 = archive_entry_filetype(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x93',0xa000,"AE_IFLNK",(ulong)mVar3,"archive_entry_filetype(ae)",
                      (void *)0x0);
  pcVar6 = archive_entry_symlink(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
             ,L'\x95',"long-joliet-file-name.textfile","\"long-joliet-file-name.textfile\"",pcVar6,
             "archive_entry_symlink(ae)",(void *)0x0,L'\0');
  iVar7 = archive_entry_size(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x96',0,"0",iVar7,"archive_entry_size(ae)",(void *)0x0);
  tVar8 = archive_entry_mtime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x97',0x2a302,"172802",tVar8,"archive_entry_mtime(ae)",(void *)0x0);
  tVar8 = archive_entry_atime(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x98',0x2a302,"172802",tVar8,"archive_entry_atime(ae)",(void *)0x0);
  uVar4 = archive_entry_nlink(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x99',1,"1",(ulong)uVar4,"archive_entry_nlink(ae)",(void *)0x0);
  iVar7 = archive_entry_uid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9a',1,"1",iVar7,"archive_entry_uid(ae)",(void *)0x0);
  iVar7 = archive_entry_gid(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9b',2,"2",iVar7,"archive_entry_gid(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9c',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\x9d',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",paVar5);
  iVar1 = archive_read_next_header(paVar5,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'\xa0',1,"ARCHIVE_EOF",(long)iVar1,"archive_read_next_header(a, &ae)",
                      (void *)0x0);
  iVar1 = archive_filter_code(paVar5,0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'£',(long)iVar1,"archive_filter_code(a, 0)",3,"ARCHIVE_FILTER_COMPRESS",
                      (void *)0x0);
  iVar1 = archive_format(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'¤',(long)iVar1,"archive_format(a)",0x40001,
                      "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
  iVar1 = archive_read_close(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'§',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",paVar5);
  iVar1 = archive_read_free(paVar5);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_read_format_isojoliet_rr.c"
                      ,L'¨',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isojoliet_rr)
{
	const char *refname = "test_read_format_iso_joliet_rockridge.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* First entry is '.' root directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString(".", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_mtime_nsec(ae));
	assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualIntA(a, ARCHIVE_EOF,
	    archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt((int)size, 0);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A directory. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("dir", archive_entry_pathname(ae));
	assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
	assertEqualInt(2048, archive_entry_size(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A regular file with two names ("hardlink" gets returned
	 * first, so it's not marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("hardlink",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assert(archive_entry_hardlink(ae) == NULL);
	assertEqualInt(6, archive_entry_size(ae));
	assertEqualInt(0, archive_read_data_block(a, &p, &size, &offset));
	assertEqualInt(6, (int)size);
	assertEqualInt(0, offset);
	assertEqualMem(p, "hello\n", 6);
	assertEqualInt(86401, archive_entry_mtime(ae));
	/* mkisofs records their access time. */
	/*assertEqualInt(86401, archive_entry_atime(ae));*/
	/* TODO: Actually, libarchive should be able to
	 * compute nlinks correctly even without RR
	 * extensions. See comments in libarchive source. */
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Second name for the same regular file (this happens to be
	 * returned second, so does get marked as a hardlink). */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("long-joliet-file-name.textfile",
	    archive_entry_pathname(ae));
	assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
	assertEqualString("hardlink",
	    archive_entry_hardlink(ae));
	assert(!archive_entry_size_is_set(ae));
	assertEqualInt(86401, archive_entry_mtime(ae));
	assertEqualInt(86401, archive_entry_atime(ae));
	/* TODO: See above. */
	assertEqualInt(2, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* A symlink to the regular file. */
	assertEqualInt(0, archive_read_next_header(a, &ae));
	assertEqualString("symlink", archive_entry_pathname(ae));
	assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
	assertEqualString("long-joliet-file-name.textfile",
	    archive_entry_symlink(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(172802, archive_entry_mtime(ae));
	assertEqualInt(172802, archive_entry_atime(ae));
	assertEqualInt(1, archive_entry_nlink(ae));
	assertEqualInt(1, archive_entry_uid(ae));
	assertEqualInt(2, archive_entry_gid(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}